

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_auto_choose_color
               (LodePNGColorMode *mode_out,uchar *image,uint w,uint h,LodePNGColorMode *mode_in)

{
  uchar **ppuVar1;
  LodePNGColorType LVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  LodePNGColorProfile prof;
  LodePNGColorProfile local_450;
  
  local_450.alpha = 0;
  local_450.numcolors = 0;
  local_450.colored = 0;
  local_450.key._0_2_ = 0;
  local_450.key._2_2_ = 0;
  local_450.key_r = 0;
  local_450.key_g = 0;
  local_450.key_b = 0;
  local_450.bits = 1;
  lodepng_get_color_profile(&local_450,image,w,h,mode_in);
  mode_out->key_defined = 0;
  if ((h * w < 0x11) && (CONCAT22(local_450.key._2_2_,(undefined2)local_450.key) != 0)) {
    local_450.alpha = 1;
    local_450.key._0_2_ = 0;
    local_450.key._2_2_ = 0;
    if (local_450.bits < 8) {
      local_450.bits = 8;
    }
  }
  uVar6 = 1;
  if ((2 < local_450.numcolors) && (uVar6 = 2, 4 < local_450.numcolors)) {
    uVar6 = (uint)(0x10 < local_450.numcolors) * 4 + 4;
  }
  if (((uVar6 < local_450.bits || local_450.colored != 0) &&
      (local_450.numcolors * 2 <= h * w && local_450.numcolors < 0x101)) && local_450.bits < 9) {
    ppuVar1 = &mode_out->palette;
    if (mode_out->palette != (uchar *)0x0) {
      free(mode_out->palette);
    }
    *ppuVar1 = (uchar *)0x0;
    mode_out->palettesize = 0;
    if (local_450.numcolors == 0) {
      uVar3 = 0;
    }
    else {
      uVar5 = 0;
      uVar4 = 3;
      do {
        uVar3 = lodepng_palette_add(mode_out,local_450.palette[uVar4 - 3],
                                    local_450.palette[uVar4 - 2],local_450.palette[uVar4 - 1],
                                    local_450.palette[uVar4]);
        if (uVar3 != 0) goto LAB_001110b3;
        uVar5 = uVar5 + 1;
        uVar4 = uVar4 + 4;
      } while (uVar5 != local_450.numcolors);
      uVar3 = 0;
    }
LAB_001110b3:
    mode_out->colortype = LCT_PALETTE;
    mode_out->bitdepth = uVar6;
    if (((mode_in->colortype == LCT_PALETTE) && (mode_out->palettesize <= mode_in->palettesize)) &&
       (mode_in->bitdepth == uVar6)) {
      if (*ppuVar1 != (uchar *)0x0) {
        free(*ppuVar1);
      }
      *ppuVar1 = (uchar *)0x0;
      mode_out->palettesize = 0;
      lodepng_color_mode_copy(mode_out,mode_in);
    }
  }
  else {
    mode_out->bitdepth = local_450.bits;
    bVar7 = local_450.colored != 0;
    LVar2 = bVar7 + 4 + (uint)bVar7;
    if (local_450.alpha == 0) {
      LVar2 = (uint)bVar7 * 2;
    }
    mode_out->colortype = LVar2;
    uVar3 = 0;
    if (CONCAT22(local_450.key._2_2_,(undefined2)local_450.key) != 0) {
      uVar6 = ~(-1 << ((byte)local_450.bits & 0x1f));
      mode_out->key_r = local_450.key_r & uVar6;
      mode_out->key_g = local_450.key_g & uVar6;
      mode_out->key_b = local_450.key_b & uVar6;
      mode_out->key_defined = 1;
    }
  }
  return uVar3;
}

Assistant:

unsigned lodepng_auto_choose_color(LodePNGColorMode* mode_out,
	const unsigned char* image, unsigned w, unsigned h,
	const LodePNGColorMode* mode_in)
{
	LodePNGColorProfile prof;
	unsigned error = 0;
	unsigned i, n, palettebits, palette_ok;

	lodepng_color_profile_init(&prof);
	error = lodepng_get_color_profile(&prof, image, w, h, mode_in);
	if (error) return error;
	mode_out->key_defined = 0;

	if (prof.key && w * h <= 16)
	{
		prof.alpha = 1; /*too few pixels to justify tRNS chunk overhead*/
		prof.key = 0;
		if (prof.bits < 8) prof.bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
	}
	n = prof.numcolors;
	palettebits = n <= 2 ? 1 : (n <= 4 ? 2 : (n <= 16 ? 4 : 8));
	palette_ok = n <= 256 && prof.bits <= 8;
	if (w * h < n * 2) palette_ok = 0; /*don't add palette overhead if image has only a few pixels*/
	if (!prof.colored && prof.bits <= palettebits) palette_ok = 0; /*grey is less overhead*/

	if (palette_ok)
	{
		unsigned char* p = prof.palette;
		lodepng_palette_clear(mode_out); /*remove potential earlier palette*/
		for (i = 0; i != prof.numcolors; ++i)
		{
			error = lodepng_palette_add(mode_out, p[i * 4 + 0], p[i * 4 + 1], p[i * 4 + 2], p[i * 4 + 3]);
			if (error) break;
		}

		mode_out->colortype = LCT_PALETTE;
		mode_out->bitdepth = palettebits;

		if (mode_in->colortype == LCT_PALETTE && mode_in->palettesize >= mode_out->palettesize
			&& mode_in->bitdepth == mode_out->bitdepth)
		{
			/*If input should have same palette colors, keep original to preserve its order and prevent conversion*/
			lodepng_color_mode_cleanup(mode_out);
			lodepng_color_mode_copy(mode_out, mode_in);
		}
	}
	else /*8-bit or 16-bit per channel*/
	{
		mode_out->bitdepth = prof.bits;
		mode_out->colortype = prof.alpha ? (prof.colored ? LCT_RGBA : LCT_GREY_ALPHA)
			: (prof.colored ? LCT_RGB : LCT_GREY);

		if (prof.key)
		{
			unsigned mask = (1u << mode_out->bitdepth) - 1u; /*profile always uses 16-bit, mask converts it*/
			mode_out->key_r = prof.key_r & mask;
			mode_out->key_g = prof.key_g & mask;
			mode_out->key_b = prof.key_b & mask;
			mode_out->key_defined = 1;
		}
	}

	return error;
}